

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O3

void __thiscall
vkt::Draw::PipelineLayoutCreateInfo::PipelineLayoutCreateInfo
          (PipelineLayoutCreateInfo *this,
          vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
          *setLayouts,deUint32 _pushConstantRangeCount,VkPushConstantRange *_pPushConstantRanges)

{
  deUint32 dVar1;
  pointer pVVar2;
  allocator_type local_21;
  
  std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
  vector(&this->m_setLayouts,setLayouts);
  std::vector<vk::VkPushConstantRange,std::allocator<vk::VkPushConstantRange>>::
  vector<vk::VkPushConstantRange_const*,void>
            ((vector<vk::VkPushConstantRange,std::allocator<vk::VkPushConstantRange>> *)
             &this->m_pushConstantRanges,_pPushConstantRanges,
             _pPushConstantRanges + _pushConstantRangeCount,&local_21);
  (this->super_VkPipelineLayoutCreateInfo).sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  (this->super_VkPipelineLayoutCreateInfo).pNext = (void *)0x0;
  (this->super_VkPipelineLayoutCreateInfo).flags = 0;
  pVVar2 = (pointer)(this->m_setLayouts).
                    super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  dVar1 = (deUint32)
          ((ulong)((long)(this->m_setLayouts).
                         super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2) >> 3);
  if (dVar1 == 0) {
    pVVar2 = (pointer)0x0;
  }
  (this->super_VkPipelineLayoutCreateInfo).setLayoutCount = dVar1;
  (this->super_VkPipelineLayoutCreateInfo).pSetLayouts = (VkDescriptorSetLayout *)pVVar2;
  pVVar2 = (this->m_pushConstantRanges).
           super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar1 = (int)((ulong)((long)(this->m_pushConstantRanges).
                              super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2) >> 2) *
          -0x55555555;
  (this->super_VkPipelineLayoutCreateInfo).pushConstantRangeCount = dVar1;
  if (dVar1 == 0) {
    pVVar2 = (pointer)0x0;
  }
  (this->super_VkPipelineLayoutCreateInfo).pPushConstantRanges = pVVar2;
  return;
}

Assistant:

PipelineLayoutCreateInfo::PipelineLayoutCreateInfo (const std::vector<vk::VkDescriptorSetLayout>&	setLayouts,
													deUint32										_pushConstantRangeCount,
													const vk::VkPushConstantRange*					_pPushConstantRanges)
	: m_setLayouts			(setLayouts)
	, m_pushConstantRanges	(_pPushConstantRanges, _pPushConstantRanges + _pushConstantRangeCount)
{
	sType = vk::VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
	pNext = DE_NULL;

	flags			= 0;
	setLayoutCount	= static_cast<deUint32>(m_setLayouts.size());

	if (setLayoutCount)
	{
		pSetLayouts = &m_setLayouts[0];
	}
	else
	{
		pSetLayouts = DE_NULL;
	}

	pushConstantRangeCount = static_cast<deUint32>(m_pushConstantRanges.size());
	if (pushConstantRangeCount) {
		pPushConstantRanges = &m_pushConstantRanges[0];
	}
	else
	{
		pPushConstantRanges = DE_NULL;
	}
}